

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionFuncs.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::BitsToRealFunction::~BitsToRealFunction(BitsToRealFunction *this)

{
  SimpleSystemSubroutine::~SimpleSystemSubroutine(&this->super_SimpleSystemSubroutine);
  operator_delete(this,0x68);
  return;
}

Assistant:

explicit BitsToRealFunction(const Builtins& builtins) :
        SimpleSystemSubroutine(KnownSystemName::BitsToReal, SubroutineKind::Function, 1,
                               {&builtins.ulongIntType}, builtins.realType, false) {}